

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::SubDataToUndefinedCase::iterate(SubDataToUndefinedCase *this)

{
  uint buffer;
  deUint32 dVar1;
  int iVar2;
  char *description;
  byte bVar3;
  size_t in_R9;
  pointer pVVar4;
  deUint8 *ptr;
  BufferVerifier verifier;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> definedRanges;
  ReferenceBuffer refBuf;
  BufferVerifier local_a0;
  uint local_98;
  deUint32 local_94;
  CallLogWrapper *local_90;
  _Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_48;
  
  local_94 = deStringHash((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.
                          m_name._M_dataplus._M_p);
  BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_a0,(this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  local_68._M_impl.super__Vector_impl_data._M_start = (uchar *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&local_68,this->m_size);
  dVar1 = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  local_90 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(local_90,this->m_target,dVar1);
  glu::CallLogWrapper::glBufferData
            (local_90,this->m_target,(long)this->m_size,(void *)0x0,this->m_usage);
  BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  local_98 = dVar1;
  for (pVVar4 = (this->m_ranges).
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start; buffer = local_98,
      pVVar4 != (this->m_ranges).
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    iVar2 = pVVar4->m_data[1];
    ptr = local_68._M_impl.super__Vector_impl_data._M_start + pVVar4->m_data[0];
    dVar1 = deInt32Hash(pVVar4->m_data[0] + iVar2);
    BufferTestUtil::fillWithRandomBytes(ptr,iVar2,dVar1 ^ local_94);
    glu::CallLogWrapper::glBufferSubData
              (local_90,this->m_target,(long)pVVar4->m_data[0],(long)pVVar4->m_data[1],
               local_68._M_impl.super__Vector_impl_data._M_start + pVVar4->m_data[0]);
    addRangeToList((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&local_48,
                   (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&local_88,
                   pVVar4);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::_M_move_assign
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&local_88,
               &local_48);
    std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
              (&local_48);
  }
  bVar3 = 1;
  for (pVVar4 = local_88._M_impl.super__Vector_impl_data._M_start;
      pVVar4 != local_88._M_impl.super__Vector_impl_data._M_finish; pVVar4 = pVVar4 + 1) {
    iVar2 = BufferTestUtil::BufferVerifier::verify
                      (&local_a0,(EVP_PKEY_CTX *)(ulong)buffer,
                       local_68._M_impl.super__Vector_impl_data._M_start,
                       (ulong)(uint)pVVar4->m_data[0],(uchar *)(ulong)(uint)pVVar4->m_data[1],in_R9)
    ;
    bVar3 = bVar3 & (byte)iVar2;
  }
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
  description = "Buffer verification failed";
  if (bVar3 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar3 & QP_TEST_RESULT_FAIL,description);
  std::_Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~_Vector_base
            (&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  BufferTestUtil::BufferVerifier::~BufferVerifier(&local_a0);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName());
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= true;
		std::vector<tcu::IVec2>	definedRanges;

		refBuf.setSize(m_size);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);

		// Initialize storage with glBufferData()
		glBufferData(m_target, m_size, DE_NULL, m_usage);
		checkError();

		// Fill specified ranges with glBufferSubData()
		for (vector<tcu::IVec2>::const_iterator range = m_ranges.begin(); range != m_ranges.end(); range++)
		{
			fillWithRandomBytes(refBuf.getPtr()+range->x(), range->y(), dataSeed ^ deInt32Hash(range->x()+range->y()));
			glBufferSubData(m_target, range->x(), range->y(), refBuf.getPtr()+range->x());

			// Mark range as defined
			definedRanges = addRangeToList(definedRanges, *range);
		}

		// Verify defined parts
		for (vector<tcu::IVec2>::const_iterator range = definedRanges.begin(); range != definedRanges.end(); range++)
		{
			if (!verifier.verify(buf, refBuf.getPtr(), range->x(), range->y()))
				isOk = false;
		}

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}